

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnLocalName
          (BinaryReaderIR *this,Index func_index,Index param_2,string_view name)

{
  bool bVar1;
  reference ppFVar2;
  BindingHash *this_00;
  BinaryReaderIR *pBVar3;
  string_view name_00;
  Binding local_c0;
  BinaryReaderIR *local_88;
  char *pcStack_80;
  string local_78;
  string local_58;
  value_type local_38;
  Func *func;
  Index local_index_local;
  Index func_index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  pBVar3 = (BinaryReaderIR *)name.data_;
  func._0_4_ = param_2;
  func._4_4_ = func_index;
  _local_index_local = this;
  this_local = pBVar3;
  bVar1 = string_view::empty((string_view *)&this_local);
  if (bVar1) {
    Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  }
  else {
    ppFVar2 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                        (&this->module_->funcs,(ulong)func._4_4_);
    local_38 = *ppFVar2;
    this_00 = &local_38->bindings;
    local_88 = this_local;
    pcStack_80 = name_local.data_;
    name_00.size_ = (size_type)pBVar3;
    name_00.data_ = name_local.data_;
    (anonymous_namespace)::MakeDollarName_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)this_local,name_00);
    GetUniqueName(&local_58,this,this_00,&local_78);
    Binding::Binding(&local_c0,(Index)func);
    std::
    unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
    ::emplace<std::__cxx11::string,wabt::Binding>
              ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                *)this_00,&local_58,&local_c0);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  }
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnLocalName(Index func_index,
                                   Index local_index,
                                   string_view name) {
  if (name.empty()) {
    return Result::Ok;
  }

  Func* func = module_->funcs[func_index];
  func->bindings.emplace(GetUniqueName(&func->bindings, MakeDollarName(name)),
                         Binding(local_index));
  return Result::Ok;
}